

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_loadfiles(Curl_easy *data)

{
  CookieInfo *pCVar1;
  CookieInfo *ci;
  curl_slist *list;
  Curl_easy *data_local;
  
  ci = (CookieInfo *)(data->state).cookielist;
  if (ci != (CookieInfo *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    for (; ci != (CookieInfo *)0x0; ci = (CookieInfo *)ci->cookielist[0]._tail) {
      pCVar1 = Curl_cookie_init(data,(char *)ci->cookielist[0]._head,data->cookies,
                                (*(ulong *)&(data->set).field_0x8ca >> 4 & 1) != 0);
      if (pCVar1 == (CookieInfo *)0x0) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"ignoring failed cookie_init for %s",ci->cookielist[0]._head);
        }
      }
      else {
        data->cookies = pCVar1;
      }
    }
    Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  }
  return;
}

Assistant:

void Curl_cookie_loadfiles(struct Curl_easy *data)
{
  struct curl_slist *list = data->state.cookielist;
  if(list) {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
    while(list) {
      struct CookieInfo *ci =
        Curl_cookie_init(data, list->data, data->cookies,
                         data->set.cookiesession);
      if(!ci)
        /*
         * Failure may be due to OOM or a bad cookie; both are ignored
         * but only the first should be
         */
        infof(data, "ignoring failed cookie_init for %s", list->data);
      else
        data->cookies = ci;
      list = list->next;
    }
    Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
  }
}